

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_obj_loader.h
# Opt level: O3

float tinyobj::parseFloat(char **token)

{
  char *pcVar1;
  char cVar2;
  long lVar3;
  uint uVar4;
  size_t sVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  char *pcVar9;
  char *pcVar10;
  float fVar11;
  double dVar12;
  double dVar13;
  double local_40;
  
  pcVar9 = *token;
  sVar5 = strspn(pcVar9," \t");
  pcVar9 = pcVar9 + sVar5;
  *token = pcVar9;
  sVar5 = strcspn(pcVar9," \t\r");
  pcVar1 = pcVar9 + sVar5;
  fVar11 = 0.0;
  if ((long)sVar5 < 1) goto LAB_001210cd;
  cVar2 = *pcVar9;
  if ((cVar2 == '-') || (cVar2 == '+')) {
    pcVar9 = pcVar9 + 1;
    dVar13 = *(double *)(&DAT_0018a070 + (ulong)(cVar2 == '+') * 8);
  }
  else {
    if (9 < (int)cVar2 - 0x30U) goto LAB_001210cd;
    dVar13 = 1.0;
  }
  if (pcVar9 == pcVar1) goto LAB_001210cd;
  local_40 = 0.0;
  iVar6 = 0;
  do {
    cVar2 = *pcVar9;
    uVar4 = (uint)cVar2;
    if (9 < uVar4 - 0x30) {
      if (iVar6 == 0) goto LAB_001210cd;
      iVar6 = 0;
      if (cVar2 != '.') {
        if ((cVar2 == 'e') || (cVar2 == 'E')) goto LAB_00120ffd;
        goto LAB_00121099;
      }
      pcVar9 = pcVar9 + 1;
      if (pcVar9 == pcVar1) goto LAB_00121099;
      iVar7 = -1;
      goto LAB_00120f9b;
    }
    local_40 = (double)(int)(uVar4 - 0x30) + local_40 * 10.0;
    pcVar9 = pcVar9 + 1;
    iVar6 = iVar6 + -1;
  } while (pcVar9 != pcVar1);
  iVar6 = 0;
  goto LAB_00121099;
LAB_00120ffd:
  fVar11 = 0.0;
  if ((uVar4 & 0xff | 0x20) == 0x65) {
    pcVar10 = pcVar9 + 1;
    cVar2 = pcVar9[1];
    if ((pcVar10 == pcVar1) || ((cVar2 != '-' && (cVar2 != '+')))) {
      iVar7 = 1;
      if (9 < (int)cVar2 - 0x30U) goto LAB_001210cd;
    }
    else {
      pcVar10 = pcVar9 + 2;
      iVar7 = (uint)(cVar2 == '+') * 2 + -1;
    }
    if (pcVar10 == pcVar1) goto LAB_001210cd;
    lVar8 = 0;
    iVar6 = 0;
    do {
      if (9 < (int)pcVar10[lVar8] - 0x30U) {
        if ((int)lVar8 == 0) goto LAB_001210cd;
        break;
      }
      iVar6 = ((int)pcVar10[lVar8] - 0x30U) + iVar6 * 10;
      lVar3 = lVar8 + 1;
      lVar8 = lVar8 + 1;
    } while (pcVar10 + lVar3 != pcVar1);
    iVar6 = iVar6 * iVar7;
  }
  goto LAB_00121099;
  while( true ) {
    dVar12 = pow(10.0,(double)iVar7);
    local_40 = local_40 + dVar12 * (double)(int)(uVar4 - 0x30);
    pcVar9 = pcVar9 + 1;
    iVar7 = iVar7 + -1;
    if (pcVar9 == pcVar1) break;
LAB_00120f9b:
    uVar4 = (uint)*pcVar9;
    if (9 < uVar4 - 0x30) goto LAB_00120ffd;
  }
LAB_00121099:
  dVar12 = pow(5.0,(double)iVar6);
  dVar12 = ldexp(dVar12 * local_40,iVar6);
  fVar11 = (float)(dVar13 * dVar12);
LAB_001210cd:
  *token = pcVar1;
  return fVar11;
}

Assistant:

static inline float parseFloat(const char *&token) {
  token += strspn(token, " \t");
#ifdef TINY_OBJ_LOADER_OLD_FLOAT_PARSER
  float f = (float)atof(token);
  token += strcspn(token, " \t\r");
#else
  const char *end = token + strcspn(token, " \t\r");
  double val = 0.0;
  tryParseDouble(token, end, &val);
  float f = static_cast<float>(val);
  token = end;
#endif
  return f;
}